

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetAndLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
     (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 != 0x1fffffff)) {
    iVar2 = Gia_ObjLevel(p,pObj + -(ulong)uVar1);
    iVar3 = Gia_ObjLevel(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (iVar2 <= iVar3) {
      iVar2 = iVar3;
    }
    Gia_ObjSetLevel(p,pObj,iVar2 + 1);
    return;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x241,"void Gia_ObjSetAndLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetAndLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsAnd(pObj) ); Gia_ObjSetLevel( p, pObj, 1+Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))) ); }